

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time_zone_info.cc
# Opt level: O0

string * __thiscall
absl::lts_20240722::time_internal::cctz::TimeZoneInfo::Description_abi_cxx11_
          (string *__return_storage_ptr__,TimeZoneInfo *this)

{
  ostream *poVar1;
  size_type sVar2;
  ostringstream local_190 [8];
  ostringstream oss;
  TimeZoneInfo *this_local;
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  poVar1 = std::operator<<((ostream *)local_190,"#trans=");
  sVar2 = std::
          vector<absl::lts_20240722::time_internal::cctz::Transition,_std::allocator<absl::lts_20240722::time_internal::cctz::Transition>_>
          ::size(&this->transitions_);
  std::ostream::operator<<(poVar1,sVar2);
  poVar1 = std::operator<<((ostream *)local_190," #types=");
  sVar2 = std::
          vector<absl::lts_20240722::time_internal::cctz::TransitionType,_std::allocator<absl::lts_20240722::time_internal::cctz::TransitionType>_>
          ::size(&this->transition_types_);
  std::ostream::operator<<(poVar1,sVar2);
  poVar1 = std::operator<<((ostream *)local_190," spec=\'");
  poVar1 = std::operator<<(poVar1,(string *)&this->future_spec_);
  std::operator<<(poVar1,"\'");
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_190);
  return __return_storage_ptr__;
}

Assistant:

std::string TimeZoneInfo::Description() const {
  std::ostringstream oss;
  oss << "#trans=" << transitions_.size();
  oss << " #types=" << transition_types_.size();
  oss << " spec='" << future_spec_ << "'";
  return oss.str();
}